

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbytarr.cpp
# Opt level: O1

int __thiscall CVmByteArraySource::seek(CVmByteArraySource *this,long ofs,int mode)

{
  long lVar1;
  
  if (mode == 2) {
    lVar1 = this->end_idx;
  }
  else {
    if (mode == 1) {
      this->idx = this->idx + ofs;
      goto LAB_0024152d;
    }
    if (mode != 0) {
      return 1;
    }
    lVar1 = this->start_idx;
  }
  this->idx = ofs + lVar1;
LAB_0024152d:
  lVar1 = this->start_idx;
  if ((lVar1 <= this->idx) && (lVar1 = this->end_idx, this->idx <= lVar1)) {
    return 0;
  }
  this->idx = lVar1;
  return 0;
}

Assistant:

virtual int seek(long ofs, int mode)
    {
        switch (mode)
        {
        case OSFSK_SET:
            idx = start_idx + ofs;
            break;

        case OSFSK_CUR:
            idx += ofs;
            break;

        case OSFSK_END:
            idx = end_idx + ofs;
            break;

        default:
            return 1;
        }

        /* make sure it's in range */
        if (idx < start_idx)
            idx = start_idx;
        else if (idx > end_idx)
            idx = end_idx;

        /* success */
        return 0;
    }